

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::walk
          (Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_> *this,Expression **root)

{
  size_t sVar1;
  pointer pTVar2;
  pointer pTVar3;
  TaskFunc p_Var4;
  Expression **ppEVar5;
  
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                  ,0x134,
                  "void wasm::Walker<GetUpdater, wasm::Visitor<GetUpdater>>::walk(Expression *&) [SubType = GetUpdater, VisitorType = wasm::Visitor<GetUpdater>]"
                 );
  }
  pushTask(this,PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::scan,root);
  while( true ) {
    sVar1 = (this->stack).usedFixed;
    pTVar2 = (this->stack).flexible.
             super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (this->stack).flexible.
             super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((long)pTVar3 - (long)pTVar2 >> 4) + sVar1 == 0) {
      return;
    }
    if (pTVar2 == pTVar3) {
      if (sVar1 == 0) {
        __assert_fail("usedFixed > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                      ,0x5a,
                      "T &wasm::SmallVector<wasm::Walker<GetUpdater, wasm::Visitor<GetUpdater>>::Task, 10>::back() [T = wasm::Walker<GetUpdater, wasm::Visitor<GetUpdater>>::Task, N = 10]"
                     );
      }
      p_Var4 = (this->stack).fixed._M_elems[sVar1 - 1].func;
      ppEVar5 = (this->stack).fixed._M_elems[sVar1 - 1].currp;
      (this->stack).usedFixed = sVar1 - 1;
    }
    else {
      p_Var4 = pTVar3[-1].func;
      ppEVar5 = pTVar3[-1].currp;
      (this->stack).flexible.
      super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = pTVar3 + -1;
    }
    this->replacep = ppEVar5;
    if (*ppEVar5 == (Expression *)0x0) break;
    (*p_Var4)((GetUpdater *)&this[-1].stack.fixed._M_elems[9].currp,ppEVar5);
  }
  __assert_fail("*task.currp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                ,0x139,
                "void wasm::Walker<GetUpdater, wasm::Visitor<GetUpdater>>::walk(Expression *&) [SubType = GetUpdater, VisitorType = wasm::Visitor<GetUpdater>]"
               );
}

Assistant:

void walk(Expression*& root) {
    assert(stack.size() == 0);
    pushTask(SubType::scan, &root);
    while (stack.size() > 0) {
      auto task = popTask();
      replacep = task.currp;
      assert(*task.currp);
      task.func(static_cast<SubType*>(this), task.currp);
    }
  }